

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int Fax4Decode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  uint32_t *puVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t *puVar11;
  byte *pbVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  int iVar18;
  TIFFFaxTabEnt *pTVar19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  byte *pbVar25;
  byte *pbVar26;
  uint uVar27;
  long lVar28;
  bool bVar29;
  uint local_94;
  uint32_t *local_90;
  uint32_t *local_70;
  long local_68;
  
  puVar4 = tif->tif_data;
  if (occ % *(long *)(puVar4 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax4Decode","Fractional scanlines cannot be read");
    return -1;
  }
  local_94 = *(uint *)(puVar4 + 0x48);
  iVar23 = *(int *)(puVar4 + 0x4c);
  iVar22 = *(int *)(puVar4 + 0x50);
  pbVar12 = tif->tif_rawcp;
  local_68 = tif->tif_rawcc;
  pbVar25 = pbVar12;
  if (0 < occ) {
    uVar3 = *(uint *)(puVar4 + 0x10);
    lVar5 = *(long *)(puVar4 + 0x40);
    pbVar12 = pbVar12 + local_68;
    iVar8 = (int)(uVar3 + 7) >> 3;
    local_70 = *(uint32_t **)(puVar4 + 0x70);
    puVar16 = *(uint **)(puVar4 + 0x78);
    do {
      iVar24 = (int)puVar16;
      local_90 = puVar16;
      if (0 < (int)uVar3) {
        uVar9 = *local_70;
        puVar11 = local_70 + 1;
        iVar18 = 0;
        uVar27 = 0;
        uVar15 = 0;
        do {
          uVar17 = *(uint *)(puVar4 + 0x68);
          if (puVar16 + uVar17 <= local_90) goto LAB_00298075;
          if (iVar23 < 7) {
            if (pbVar25 < pbVar12) {
              bVar1 = *pbVar25;
              pbVar25 = pbVar25 + 1;
              local_94 = local_94 | (uint)*(byte *)(lVar5 + (ulong)bVar1) << ((byte)iVar23 & 0x1f);
              iVar23 = iVar23 + 8;
            }
            else {
              bVar29 = iVar23 == 0;
              iVar23 = 7;
              if (bVar29) goto LAB_0029811e;
            }
          }
          uVar20 = local_94 & 0x7f;
          local_94 = local_94 >> (TIFFFaxMainTable[uVar20].Width & 0x1f);
          iVar23 = iVar23 - (uint)TIFFFaxMainTable[uVar20].Width;
          switch(TIFFFaxMainTable[uVar20].State) {
          case '\x01':
            if ((local_90 != puVar16) && ((int)uVar9 <= (int)uVar27)) {
              puVar7 = puVar11 + 1;
              do {
                puVar11 = puVar7;
                if (local_70 + uVar17 <= puVar11) goto LAB_00298075;
                uVar9 = uVar9 + puVar11[-1] + *puVar11;
                puVar7 = puVar11 + 2;
              } while ((int)uVar9 <= (int)uVar27);
              puVar11 = puVar11 + 1;
            }
            if (local_70 + uVar17 <= puVar11 + 1) goto LAB_00298075;
            uVar27 = uVar9 + *puVar11;
            uVar15 = iVar18 + uVar15 + uVar27;
            puVar7 = puVar11 + 1;
            puVar11 = puVar11 + 2;
            uVar10 = *puVar7 + uVar27;
            break;
          case '\x02':
            pbVar26 = pbVar25;
            if (((int)local_90 - iVar24 & 4U) == 0) {
              while( true ) {
                pbVar25 = pbVar26;
                iVar18 = iVar23;
                if (iVar23 < 0xc) {
                  if (pbVar26 < pbVar12) {
                    pbVar25 = pbVar26 + 1;
                    local_94 = local_94 |
                               (uint)*(byte *)(lVar5 + (ulong)*pbVar26) << ((byte)iVar23 & 0x1f);
                    iVar18 = iVar23 + 8;
                    if (iVar23 < 4) {
                      if (pbVar25 < pbVar12) {
                        local_94 = local_94 |
                                   (uint)*(byte *)(lVar5 + (ulong)pbVar26[1]) <<
                                   ((byte)iVar18 & 0x1f);
                        iVar18 = iVar23 + 0x10;
                        pbVar25 = pbVar26 + 2;
                      }
                      else {
                        iVar18 = 0xc;
                      }
                    }
                  }
                  else {
                    iVar18 = 0xc;
                    if (iVar23 == 0) goto LAB_0029811e;
                  }
                }
                uVar17 = local_94 & 0xfff;
                local_94 = local_94 >> (TIFFFaxWhiteTable[uVar17].Width & 0x1f);
                iVar23 = iVar18 - (uint)TIFFFaxWhiteTable[uVar17].Width;
                uVar2 = TIFFFaxWhiteTable[uVar17].State;
                if ((uVar2 != '\t') && (uVar2 != '\v')) break;
                uVar27 = uVar27 + TIFFFaxWhiteTable[uVar17].Param;
                uVar15 = uVar15 + TIFFFaxWhiteTable[uVar17].Param;
                pbVar26 = pbVar25;
              }
              if (uVar2 == '\a') {
                uVar10 = TIFFFaxWhiteTable[uVar17].Param;
                *local_90 = uVar15 + uVar10;
                uVar27 = uVar27 + uVar10;
                uVar15 = 0;
                pbVar26 = pbVar25;
                while( true ) {
                  pbVar25 = pbVar26;
                  iVar18 = iVar23;
                  if (iVar23 < 0xd) {
                    if (pbVar26 < pbVar12) {
                      pbVar25 = pbVar26 + 1;
                      local_94 = local_94 |
                                 (uint)*(byte *)(lVar5 + (ulong)*pbVar26) << ((byte)iVar23 & 0x1f);
                      iVar18 = iVar23 + 8;
                      if (iVar23 < 5) {
                        if (pbVar25 < pbVar12) {
                          pbVar25 = pbVar26 + 2;
                          local_94 = local_94 |
                                     (uint)*(byte *)(lVar5 + (ulong)pbVar26[1]) <<
                                     ((byte)iVar18 & 0x1f);
                          iVar18 = iVar23 + 0x10;
                        }
                        else {
                          iVar18 = 0xd;
                        }
                      }
                    }
                    else {
                      iVar18 = 0xd;
                      if (iVar23 == 0) goto LAB_00298114;
                    }
                  }
                  uVar17 = local_94 & 0x1fff;
                  pTVar19 = TIFFFaxBlackTable + uVar17;
                  local_94 = local_94 >> (TIFFFaxBlackTable[uVar17].Width & 0x1f);
                  iVar23 = iVar18 - (uint)TIFFFaxBlackTable[uVar17].Width;
                  if (1 < pTVar19->State - 10) break;
                  uVar27 = uVar27 + TIFFFaxBlackTable[uVar17].Param;
                  uVar15 = uVar15 + TIFFFaxBlackTable[uVar17].Param;
                  pbVar26 = pbVar25;
                }
                if (pTVar19->State != 8) goto LAB_00297be0;
                uVar17 = *(uint *)(puVar4 + 0x68);
LAB_00297b50:
                if (local_90 + 1 < puVar16 + uVar17) {
                  uVar10 = pTVar19->Param;
                  local_90[1] = uVar15 + uVar10;
                  uVar27 = uVar27 + uVar10;
                  local_90 = local_90 + 2;
                  uVar15 = 0;
                  uVar10 = uVar9;
                  if ((local_90 != puVar16) &&
                     ((int)uVar9 < (int)uVar3 && (int)uVar9 <= (int)uVar27)) {
                    puVar7 = puVar11 + 1;
                    do {
                      puVar11 = puVar7;
                      if (local_70 + *(uint *)(puVar4 + 0x68) <= puVar11) goto LAB_00298075;
                      uVar9 = uVar9 + puVar11[-1] + *puVar11;
                    } while (((int)uVar9 <= (int)uVar27) &&
                            (puVar7 = puVar11 + 2, (int)uVar9 < (int)uVar3));
                    puVar11 = puVar11 + 1;
                    uVar10 = uVar9;
                  }
                  break;
                }
                goto LAB_00298075;
              }
            }
            else {
              while( true ) {
                pbVar25 = pbVar26;
                iVar18 = iVar23;
                if (iVar23 < 0xd) {
                  if (pbVar26 < pbVar12) {
                    pbVar25 = pbVar26 + 1;
                    local_94 = local_94 |
                               (uint)*(byte *)(lVar5 + (ulong)*pbVar26) << ((byte)iVar23 & 0x1f);
                    iVar18 = iVar23 + 8;
                    if (iVar23 < 5) {
                      if (pbVar25 < pbVar12) {
                        local_94 = local_94 |
                                   (uint)*(byte *)(lVar5 + (ulong)pbVar26[1]) <<
                                   ((byte)iVar18 & 0x1f);
                        iVar18 = iVar23 + 0x10;
                        pbVar25 = pbVar26 + 2;
                      }
                      else {
                        iVar18 = 0xd;
                      }
                    }
                  }
                  else {
                    iVar18 = 0xd;
                    if (iVar23 == 0) goto LAB_0029811e;
                  }
                }
                uVar17 = local_94 & 0x1fff;
                local_94 = local_94 >> (TIFFFaxBlackTable[uVar17].Width & 0x1f);
                iVar23 = iVar18 - (uint)TIFFFaxBlackTable[uVar17].Width;
                if (1 < TIFFFaxBlackTable[uVar17].State - 10) break;
                uVar27 = uVar27 + TIFFFaxBlackTable[uVar17].Param;
                uVar15 = uVar15 + TIFFFaxBlackTable[uVar17].Param;
                pbVar26 = pbVar25;
              }
              if (TIFFFaxBlackTable[uVar17].State == 8) {
                uVar10 = TIFFFaxBlackTable[uVar17].Param;
                *local_90 = uVar15 + uVar10;
                uVar27 = uVar27 + uVar10;
                uVar15 = 0;
                pbVar26 = pbVar25;
                while( true ) {
                  pbVar25 = pbVar26;
                  iVar18 = iVar23;
                  if (iVar23 < 0xc) {
                    if (pbVar26 < pbVar12) {
                      pbVar25 = pbVar26 + 1;
                      local_94 = local_94 |
                                 (uint)*(byte *)(lVar5 + (ulong)*pbVar26) << ((byte)iVar23 & 0x1f);
                      iVar18 = iVar23 + 8;
                      if (iVar23 < 4) {
                        if (pbVar25 < pbVar12) {
                          pbVar25 = pbVar26 + 2;
                          local_94 = local_94 |
                                     (uint)*(byte *)(lVar5 + (ulong)pbVar26[1]) <<
                                     ((byte)iVar18 & 0x1f);
                          iVar18 = iVar23 + 0x10;
                        }
                        else {
                          iVar18 = 0xc;
                        }
                      }
                    }
                    else {
                      iVar18 = 0xc;
                      if (iVar23 == 0) goto LAB_00298114;
                    }
                  }
                  uVar17 = local_94 & 0xfff;
                  pTVar19 = TIFFFaxWhiteTable + uVar17;
                  local_94 = local_94 >> (TIFFFaxWhiteTable[uVar17].Width & 0x1f);
                  iVar23 = iVar18 - (uint)TIFFFaxWhiteTable[uVar17].Width;
                  uVar2 = pTVar19->State;
                  if ((uVar2 != '\t') && (uVar2 != '\v')) break;
                  uVar27 = uVar27 + TIFFFaxWhiteTable[uVar17].Param;
                  uVar15 = uVar15 + TIFFFaxWhiteTable[uVar17].Param;
                  pbVar26 = pbVar25;
                }
                if (uVar2 == '\a') {
                  uVar17 = *(uint *)(puVar4 + 0x68);
                  goto LAB_00297b50;
                }
LAB_00297be0:
                local_90 = local_90 + 1;
              }
            }
            bVar29 = (tif->tif_flags >> 10 & 1) == 0;
            pcVar21 = "tile";
            if (bVar29) {
              pcVar21 = "strip";
            }
            puVar11 = &tif->tif_curtile;
            if (bVar29) {
              puVar11 = &tif->tif_curstrip;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Bad code word at line %u of %s %u (x %u)",
                          (ulong)*(uint *)(puVar4 + 0x98),pcVar21,(ulong)*puVar11,uVar27);
            goto LAB_00297c47;
          case '\x03':
            if ((local_90 != puVar16) && ((int)uVar9 <= (int)uVar27)) {
              puVar7 = puVar11 + 1;
              do {
                puVar11 = puVar7;
                if (local_70 + uVar17 <= puVar11) goto LAB_00298075;
                uVar9 = uVar9 + puVar11[-1] + *puVar11;
                puVar7 = puVar11 + 2;
              } while ((int)uVar9 <= (int)uVar27);
              puVar11 = puVar11 + 1;
            }
            *local_90 = iVar18 + uVar15 + uVar9;
            if (local_70 + *(uint *)(puVar4 + 0x68) <= puVar11) goto LAB_00298075;
            local_90 = local_90 + 1;
            uVar10 = *puVar11;
            puVar11 = puVar11 + 1;
            uVar15 = 0;
            uVar10 = uVar10 + uVar9;
            uVar27 = uVar9;
            break;
          case '\x04':
            if ((local_90 != puVar16) && ((int)uVar9 <= (int)uVar27)) {
              puVar7 = puVar11 + 1;
              do {
                puVar11 = puVar7;
                if (local_70 + uVar17 <= puVar11) goto LAB_00298075;
                uVar9 = uVar9 + puVar11[-1] + *puVar11;
                puVar7 = puVar11 + 2;
              } while ((int)uVar9 <= (int)uVar27);
              puVar11 = puVar11 + 1;
            }
            uVar10 = TIFFFaxMainTable[uVar20].Param;
            *local_90 = iVar18 + uVar15 + uVar9 + uVar10;
            if (puVar11 < local_70 + *(uint *)(puVar4 + 0x68)) {
              uVar27 = uVar10 + uVar9;
              uVar10 = uVar9 + *puVar11;
              puVar11 = puVar11 + 1;
              goto LAB_00297914;
            }
            goto LAB_00298075;
          case '\x05':
            if ((local_90 != puVar16) && ((int)uVar9 <= (int)uVar27)) {
              puVar7 = puVar11 + 1;
              do {
                puVar11 = puVar7;
                if (local_70 + uVar17 <= puVar11) goto LAB_00298075;
                uVar9 = uVar9 + puVar11[-1] + *puVar11;
                puVar7 = puVar11 + 2;
              } while ((int)uVar9 <= (int)uVar27);
              puVar11 = puVar11 + 1;
            }
            if ((int)uVar9 < (int)(TIFFFaxMainTable[uVar20].Param + uVar27))
            goto switchD_002975c9_caseD_7;
            iVar18 = (iVar18 + uVar9) - TIFFFaxMainTable[uVar20].Param;
            *local_90 = uVar15 + iVar18;
            uVar10 = uVar9 - puVar11[-1];
            uVar27 = iVar18 + uVar27;
            puVar11 = puVar11 + -1;
LAB_00297914:
            uVar15 = 0;
            local_90 = local_90 + 1;
            break;
          case '\x06':
            *local_90 = uVar3 - uVar27;
            local_90 = local_90 + 1;
            Fax3Extension("Fax4Decode",tif,*(uint32_t *)(puVar4 + 0x98),uVar27);
            goto LAB_00297c47;
          default:
switchD_002975c9_caseD_7:
            goto LAB_0029803d;
          case '\f':
            *local_90 = uVar3 - uVar27;
            local_90 = local_90 + 1;
            if (iVar23 < 4) {
              if (pbVar25 < pbVar12) {
                bVar1 = *pbVar25;
                pbVar25 = pbVar25 + 1;
                local_94 = local_94 | (uint)*(byte *)(lVar5 + (ulong)bVar1) << ((byte)iVar23 & 0x1f)
                ;
                iVar23 = iVar23 + 8;
              }
              else {
                bVar29 = iVar23 == 0;
                iVar23 = 4;
                if (bVar29) goto LAB_0029811e;
              }
            }
            if ((local_94 & 0xf) != 0) {
              Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar4 + 0x98),uVar27);
            }
            iVar23 = iVar23 + -4;
            local_94 = local_94 >> 4;
            iVar22 = 1;
            goto LAB_00297c47;
          }
          uVar9 = uVar10;
          iVar18 = -uVar27;
        } while ((int)uVar27 < (int)uVar3);
        if (uVar15 == 0) goto LAB_00297c97;
        if ((int)uVar3 <= (int)(uVar27 + uVar15)) {
LAB_00298064:
          if (local_90 < puVar16 + *(uint *)(puVar4 + 0x68)) {
LAB_00297c70:
            *local_90 = uVar15;
            local_90 = local_90 + 1;
            goto LAB_00297c97;
          }
LAB_00298075:
          uVar14 = (ulong)*(uint *)(puVar4 + 0x98);
          bVar29 = (tif->tif_flags >> 10 & 1) == 0;
          pcVar21 = "tile";
          if (bVar29) {
            pcVar21 = "strip";
          }
          local_90 = &tif->tif_curtile;
          if (bVar29) {
            local_90 = &tif->tif_curstrip;
          }
          goto LAB_002980a9;
        }
        if (0 < iVar23) {
LAB_00298030:
          if ((local_94 & 1) != 0) {
            iVar23 = iVar23 + -1;
            local_94 = local_94 >> 1;
            goto LAB_00298064;
          }
LAB_0029803d:
          Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar4 + 0x98),uVar27);
LAB_00297c47:
          if (uVar15 == 0) goto LAB_00297c97;
          if (local_90 < puVar16 + *(uint *)(puVar4 + 0x68)) goto LAB_00297c70;
          goto LAB_00298075;
        }
        if (pbVar25 < pbVar12) {
          bVar1 = *pbVar25;
          pbVar25 = pbVar25 + 1;
          local_94 = local_94 | (uint)*(byte *)(lVar5 + (ulong)bVar1) << ((byte)iVar23 & 0x1f);
          iVar23 = iVar23 + 8;
          goto LAB_00298030;
        }
        if (iVar23 != 0) {
          iVar23 = 1;
          goto LAB_00298030;
        }
LAB_0029811e:
        pcVar21 = "tile";
        puVar11 = &tif->tif_curtile;
        if ((tif->tif_flags >> 10 & 1) == 0) {
          pcVar21 = "strip";
          puVar11 = &tif->tif_curstrip;
        }
        iVar23 = 0;
        TIFFWarningExtR(tif,"Fax4Decode","Premature EOF at line %u of %s %u (x %u)",
                        (ulong)*(uint *)(puVar4 + 0x98),pcVar21,(ulong)*puVar11,uVar27);
        if (uVar15 == 0) {
LAB_002981d1:
          if (uVar27 == uVar3) goto LAB_002983ff;
          Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar4 + 0x98),uVar27,uVar3);
          bVar29 = (int)uVar3 < (int)uVar27;
          if (((int)uVar27 <= (int)uVar3) || (local_90 <= puVar16)) goto LAB_00298339;
          goto LAB_0029824b;
        }
        if (local_90 < puVar16 + *(uint *)(puVar4 + 0x68)) {
          *local_90 = uVar15;
          local_90 = local_90 + 1;
          goto LAB_002981d1;
        }
        bVar29 = (tif->tif_flags >> 10 & 1) == 0;
        pcVar21 = "tile";
        if (bVar29) {
          pcVar21 = "strip";
        }
        uVar3 = *(uint *)(puVar4 + 0x98);
        puVar11 = &tif->tif_curtile;
        if (bVar29) {
          puVar11 = &tif->tif_curstrip;
        }
        uVar27 = *puVar11;
LAB_002982e1:
        uVar14 = (ulong)uVar3;
        goto LAB_002980bd;
      }
      uVar27 = 0;
LAB_00297c97:
      if (uVar27 != uVar3) {
        pcVar21 = "tile";
        puVar11 = &tif->tif_curtile;
        if ((tif->tif_flags >> 10 & 1) == 0) {
          pcVar21 = "strip";
          puVar11 = &tif->tif_curstrip;
        }
        pcVar13 = "Line length mismatch";
        if (uVar27 < uVar3) {
          pcVar13 = "Premature EOL";
        }
        TIFFWarningExtR(tif,"Fax4Decode","%s at line %u of %s %u (got %u, expected %u)",pcVar13,
                        (ulong)*(uint *)(puVar4 + 0x98),pcVar21,*puVar11,uVar27,uVar3);
        while (((int)uVar3 < (int)uVar27 && (puVar16 < local_90))) {
          local_90 = local_90 + -1;
          uVar27 = uVar27 - *local_90;
        }
        if ((int)uVar27 < (int)uVar3) {
          if ((int)uVar27 < 1) {
            uVar27 = 0;
          }
          if (((int)local_90 - iVar24 & 4U) != 0) {
            if (puVar16 + *(uint *)(puVar4 + 0x68) <= local_90) goto LAB_002983c7;
            *local_90 = 0;
            local_90 = local_90 + 1;
          }
          if (puVar16 + *(uint *)(puVar4 + 0x68) <= local_90) goto LAB_002983c7;
          *local_90 = uVar3 - uVar27;
          local_90 = local_90 + 1;
        }
        else if ((int)uVar3 < (int)uVar27) {
          if ((puVar16 + *(uint *)(puVar4 + 0x68) <= local_90) ||
             (*local_90 = uVar3, puVar16 + *(uint *)(puVar4 + 0x68) <= local_90 + 1))
          goto LAB_002983c7;
          local_90[1] = 0;
          local_90 = local_90 + 2;
        }
      }
      if (iVar22 != 0) {
        pbVar26 = pbVar25;
        iVar24 = iVar23;
        if (0xc < iVar23) goto LAB_00298474;
        goto LAB_002983ff;
      }
      if ((int)occ < iVar8) goto LAB_0029847d;
      (**(code **)(puVar4 + 0x58))(buf,puVar16,local_90,uVar3);
      if (puVar16 + *(uint *)(puVar4 + 0x68) <= local_90) {
        uVar3 = *(uint *)(puVar4 + 0x98);
        bVar29 = (tif->tif_flags >> 10 & 1) == 0;
        pcVar21 = "tile";
        if (bVar29) {
          pcVar21 = "strip";
        }
        puVar11 = &tif->tif_curtile;
        if (bVar29) {
          puVar11 = &tif->tif_curstrip;
        }
        uVar27 = *puVar11;
        goto LAB_002982e1;
      }
      *local_90 = 0;
      local_70 = *(uint32_t **)(puVar4 + 0x78);
      lVar6 = *(long *)(puVar4 + 8);
      puVar16 = *(uint **)(puVar4 + 0x70);
      *(uint **)(puVar4 + 0x78) = puVar16;
      *(uint32_t **)(puVar4 + 0x70) = local_70;
      *(int *)(puVar4 + 0x98) = *(int *)(puVar4 + 0x98) + 1;
      buf = buf + lVar6;
      iVar22 = 0;
      lVar28 = occ - lVar6;
      bVar29 = lVar6 <= occ;
      occ = lVar28;
    } while (lVar28 != 0 && bVar29);
    pbVar12 = tif->tif_rawcp;
    local_68 = tif->tif_rawcc;
    iVar22 = 0;
  }
  *(int *)(puVar4 + 0x4c) = iVar23;
  *(uint *)(puVar4 + 0x48) = local_94;
  *(int *)(puVar4 + 0x50) = iVar22;
  tif->tif_rawcc = (tmsize_t)(pbVar12 + (local_68 - (long)pbVar25));
  tif->tif_rawcp = pbVar25;
  return 1;
LAB_00298114:
  local_90 = local_90 + 1;
  pbVar25 = pbVar26;
  goto LAB_0029811e;
  while (puVar16 < local_90) {
LAB_0029824b:
    local_90 = local_90 + -1;
    uVar27 = uVar27 - *local_90;
    bVar29 = (int)uVar3 < (int)uVar27;
    if ((int)uVar27 <= (int)uVar3) break;
  }
LAB_00298339:
  if ((int)uVar27 < (int)uVar3) {
    uVar9 = 0;
    if (0 < (int)uVar27) {
      uVar9 = uVar27;
    }
    if (((int)local_90 - iVar24 & 4U) == 0) {
LAB_00298369:
      if (local_90 < puVar16 + *(uint *)(puVar4 + 0x68)) {
        *local_90 = uVar3 - uVar9;
        local_90 = local_90 + 1;
        goto LAB_002983c2;
      }
    }
    else if (local_90 < puVar16 + *(uint *)(puVar4 + 0x68)) {
      *local_90 = 0;
      local_90 = local_90 + 1;
      goto LAB_00298369;
    }
LAB_002983c7:
    local_70 = &tif->tif_curstrip;
    local_90 = &tif->tif_curtile;
    bVar29 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar21 = "tile";
    if (bVar29) {
      pcVar21 = "strip";
    }
    uVar14 = (ulong)*(uint *)(puVar4 + 0x98);
    if (bVar29) {
      local_90 = local_70;
    }
LAB_002980a9:
    uVar27 = *local_90;
LAB_002980bd:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",uVar14,pcVar21,
                  (ulong)uVar27);
  }
  else {
    if (bVar29) {
      if ((puVar16 + *(uint *)(puVar4 + 0x68) <= local_90) ||
         (*local_90 = uVar3, puVar16 + *(uint *)(puVar4 + 0x68) <= local_90 + 1)) goto LAB_002983c7;
      local_90[1] = 0;
      local_90 = local_90 + 2;
LAB_002983c2:
      iVar23 = 0;
    }
LAB_002983ff:
    if (pbVar25 < pbVar12) {
      pbVar26 = pbVar25 + 1;
      local_94 = local_94 | (uint)*(byte *)(lVar5 + (ulong)*pbVar25) << ((byte)iVar23 & 0x1f);
      iVar24 = iVar23 + 8;
      if (iVar23 < 5) {
        if (pbVar26 < pbVar12) {
          local_94 = local_94 |
                     (uint)*(byte *)(lVar5 + (ulong)pbVar25[1]) << ((byte)(iVar23 + 8) & 0x1f);
          pbVar26 = pbVar25 + 2;
          iVar24 = iVar23 + 0x10;
        }
        else {
          iVar24 = 0xd;
        }
      }
    }
    else {
      pbVar26 = pbVar25;
      iVar24 = 0xd;
      if (iVar23 == 0) {
        iVar24 = 0;
      }
    }
LAB_00298474:
    if (iVar8 <= (int)occ) {
      (**(code **)(puVar4 + 0x58))(buf,puVar16,local_90,uVar3);
      *(int *)(puVar4 + 0x4c) = iVar24 + -0xd;
      *(uint *)(puVar4 + 0x48) = local_94 >> 0xd;
      *(int *)(puVar4 + 0x50) = iVar22;
      tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar26));
      tif->tif_rawcp = pbVar26;
      return -(uint)(*(int *)(puVar4 + 0x98) == 0) | 1;
    }
LAB_0029847d:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overrun detected : %ld bytes available, %d bits needed");
  }
  return -1;
}

Assistant:

static int Fax4Decode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE_2D(tif, sp, "Fax4Decode");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun = sp->curruns;
        pb = sp->refruns;
        b1 = *pb++;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %d\n", tif->tif_row);
        fflush(stdout);
#endif
        EXPAND2D(EOFG4);
        if (EOLcnt)
            goto EOFG4;
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        SETVALUE(0); /* imaginary change for reference */
        SWAP(uint32_t *, sp->curruns, sp->refruns);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOFG4:
        NeedBits16(13, BADG4);
    BADG4:
#ifdef FAX3_DEBUG
        if (GetBits(13) != 0x1001)
            fputs("Bad EOFB\n", stderr);
#endif
        ClrBits(13);
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (sp->line ? 1 : -1); /* don't error on badly-terminated strips */
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}